

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

ppcmas_tlb_t * booke206_cur_tlb(CPUPPCState_conflict2 *env)

{
  int tlbn;
  CPUState *cpu;
  ppcmas_tlb_t *ppVar1;
  int tlb;
  int ea;
  int esel;
  uint32_t tlbncfg;
  CPUPPCState_conflict2 *env_local;
  
  tlbn = (int)((env->spr[0x270] & 0x30000000) >> 0x1c);
  if (((env->spr[tlbn + 0x2b0] & 0x2000) != 0) && ((env->spr[0x270] & 0x4000) != 0)) {
    cpu = env_cpu(env);
    cpu_abort_ppc64(cpu,"we don\'t support HES yet\n");
  }
  ppVar1 = booke206_get_tlbm(env,tlbn,(long)(int)((uint)env->spr[0x272] & 0xfffff000),
                             (uint)(env->spr[0x270] >> 0x10) & 0xfff);
  return ppVar1;
}

Assistant:

static ppcmas_tlb_t *booke206_cur_tlb(CPUPPCState *env)
{
    uint32_t tlbncfg = 0;
    int esel = (env->spr[SPR_BOOKE_MAS0] & MAS0_ESEL_MASK) >> MAS0_ESEL_SHIFT;
    int ea = (env->spr[SPR_BOOKE_MAS2] & MAS2_EPN_MASK);
    int tlb;

    tlb = (env->spr[SPR_BOOKE_MAS0] & MAS0_TLBSEL_MASK) >> MAS0_TLBSEL_SHIFT;
    tlbncfg = env->spr[SPR_BOOKE_TLB0CFG + tlb];

    if ((tlbncfg & TLBnCFG_HES) && (env->spr[SPR_BOOKE_MAS0] & MAS0_HES)) {
        cpu_abort(env_cpu(env), "we don't support HES yet\n");
    }

    return booke206_get_tlbm(env, tlb, ea, esel);
}